

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O1

FILE * getiofile(lua_State *L,char *findex)

{
  undefined8 *puVar1;
  
  lua_getfield(L,-0xf4628,findex);
  puVar1 = (undefined8 *)lua_touserdata(L,-1);
  if (puVar1[1] == 0) {
    luaL_error(L,"standard %s file is closed",findex + 4);
  }
  return (FILE *)*puVar1;
}

Assistant:

static FILE *getiofile(lua_State *L, const char *findex) {
    LStream *p;
    lua_getfield(L, LUA_REGISTRYINDEX, findex);
    p = (LStream *) lua_touserdata(L, -1);
    if (isclosed(p))
        luaL_error(L, "standard %s file is closed", findex + IOPREF_LEN);
    return p->f;
}